

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_unit.cpp
# Opt level: O0

void serial_test(void **param_1)

{
  size_t sVar1;
  char *expression;
  size_t in_RCX;
  Roaring t2;
  char *copy;
  Roaring t;
  char *serializedbytes;
  uint32_t serializesize;
  Roaring r1;
  uint32_t values [5];
  Roaring *in_stack_ffffffffffffff08;
  Roaring *in_stack_ffffffffffffff10;
  Roaring *pRVar2;
  char *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  uint uVar3;
  Roaring *in_stack_ffffffffffffff30;
  undefined1 local_c8 [40];
  char *local_a0;
  undefined1 local_98 [56];
  Roaring *local_60;
  uint local_54;
  Roaring local_50;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined4 local_18;
  
  local_28 = 0x200000005;
  uStack_20 = 0x400000003;
  local_18 = 1;
  pRVar2 = &local_50;
  roaring::Roaring::Roaring
            (in_stack_ffffffffffffff30,(size_t)pRVar2,
             (uint32_t *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  sVar1 = roaring::Roaring::getSizeInBytes(pRVar2,SUB41((uint)in_stack_ffffffffffffff24 >> 0x18,0));
  local_54 = (uint)sVar1;
  local_60 = (Roaring *)operator_new__(sVar1 & 0xffffffff);
  uVar3 = 1;
  roaring::Roaring::write(&local_50,(int)local_60,(void *)0x1,in_RCX);
  roaring::Roaring::read((int)local_98,local_60,(ulong)uVar3);
  roaring::Roaring::operator==(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  _assert_true(CONCAT44(uVar3,in_stack_ffffffffffffff20),in_stack_ffffffffffffff18,
               (char *)in_stack_ffffffffffffff10,(int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
  expression = (char *)operator_new__((ulong)local_54);
  local_a0 = expression;
  memcpy(expression,local_60,(ulong)local_54);
  roaring::Roaring::read((int)local_c8,local_a0,1);
  roaring::Roaring::operator==(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  _assert_true(CONCAT44(uVar3,in_stack_ffffffffffffff20),expression,
               (char *)in_stack_ffffffffffffff10,(int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
  pRVar2 = local_60;
  if (local_60 != (Roaring *)0x0) {
    operator_delete__(local_60);
  }
  if (local_a0 != (char *)0x0) {
    operator_delete__(local_a0);
  }
  roaring::Roaring::~Roaring(pRVar2);
  roaring::Roaring::~Roaring(pRVar2);
  roaring::Roaring::~Roaring(pRVar2);
  return;
}

Assistant:

DEFINE_TEST(serial_test) {
    uint32_t values[] = {5, 2, 3, 4, 1};
    Roaring r1(sizeof(values) / sizeof(uint32_t), values);
    uint32_t serializesize = r1.getSizeInBytes();
    char *serializedbytes = new char[serializesize];
    r1.write(serializedbytes);
    Roaring t = Roaring::read(serializedbytes);
    assert_true(r1 == t);
    char *copy = new char[serializesize];
    memcpy(copy, serializedbytes, serializesize);
    Roaring t2 = Roaring::read(copy);
    assert_true(t2 == t);
    delete[] serializedbytes;
    delete[] copy;
}